

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txindex.cpp
# Opt level: O0

void __thiscall TxIndex::DB::DB(DB *this,size_t n_cache_size,bool f_memory,bool f_wipe)

{
  long lVar1;
  char *in_RDI;
  long in_FS_OFFSET;
  path *in_stack_ffffffffffffff38;
  ArgsManager *in_stack_ffffffffffffff40;
  path *p1;
  undefined1 in_stack_ffffffffffffff85;
  undefined1 in_stack_ffffffffffffff86;
  undefined1 in_stack_ffffffffffffff87;
  size_t in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  p1 = (path *)&stack0xffffffffffffff80;
  ArgsManager::GetDataDirNet(in_stack_ffffffffffffff40);
  fs::operator/(p1,in_RDI);
  fs::operator/(p1,in_RDI);
  BaseIndex::DB::DB((DB *)in_stack_ffffffffffffff98,(path *)in_stack_ffffffffffffff90,
                    in_stack_ffffffffffffff88,(bool)in_stack_ffffffffffffff87,
                    (bool)in_stack_ffffffffffffff86,(bool)in_stack_ffffffffffffff85);
  fs::path::~path(in_stack_ffffffffffffff38);
  fs::path::~path(in_stack_ffffffffffffff38);
  fs::path::~path(in_stack_ffffffffffffff38);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

TxIndex::DB::DB(size_t n_cache_size, bool f_memory, bool f_wipe) :
    BaseIndex::DB(gArgs.GetDataDirNet() / "indexes" / "txindex", n_cache_size, f_memory, f_wipe)
{}